

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O0

void Ivy_ManHaigStop(Ivy_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  int local_1c;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *p_local;
  
  if (p->pHaig != (Ivy_Man_t *)0x0) {
    Vec_IntFree((Vec_Int_t *)p->pHaig->pData);
    Ivy_ManStop(p->pHaig);
    p->pHaig = (Ivy_Man_t *)0x0;
    for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
      pvVar2 = Vec_PtrEntry(p->vObjs,local_1c);
      if (pvVar2 != (void *)0x0) {
        *(undefined8 *)((long)pvVar2 + 0x48) = 0;
      }
    }
    return;
  }
  __assert_fail("p->pHaig != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyHaig.c"
                ,0xa3,"void Ivy_ManHaigStop(Ivy_Man_t *)");
}

Assistant:

void Ivy_ManHaigStop( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    assert( p->pHaig != NULL );
    Vec_IntFree( (Vec_Int_t *)p->pHaig->pData );
    Ivy_ManStop( p->pHaig );
    p->pHaig = NULL;
    // remove dangling pointers to the HAIG objects
    Ivy_ManForEachObj( p, pObj, i )
        pObj->pEquiv = NULL;
}